

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_dense.c
# Opt level: O0

SUNLinearSolver SUNLinSol_Dense(N_Vector y,SUNMatrix A,SUNContext sunctx)

{
  SUNMatrix_ID SVar1;
  sunindextype sVar2;
  sunindextype sVar3;
  N_Vector_ID NVar4;
  sunindextype sVar5;
  sunindextype sVar6;
  int *piVar7;
  void *pvVar8;
  sunindextype MatrixRows;
  SUNLinearSolverContent_Dense content;
  SUNLinearSolver S;
  SUNLinearSolver in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  SUNLinearSolver local_8;
  
  SVar1 = SUNMatGetID((SUNMatrix)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if (SVar1 == SUNMATRIX_DENSE) {
    sVar2 = SUNDenseMatrix_Rows((SUNMatrix)in_stack_ffffffffffffffb8);
    sVar3 = SUNDenseMatrix_Columns((SUNMatrix)in_stack_ffffffffffffffb8);
    if (sVar2 == sVar3) {
      NVar4 = N_VGetVectorID((N_Vector)0xed7c6a);
      if (((NVar4 == SUNDIALS_NVEC_SERIAL) ||
          (NVar4 = N_VGetVectorID((N_Vector)0xed7c79), NVar4 == SUNDIALS_NVEC_OPENMP)) ||
         (NVar4 = N_VGetVectorID((N_Vector)0xed7c88), NVar4 == SUNDIALS_NVEC_PTHREADS)) {
        sVar5 = SUNDenseMatrix_Rows((SUNMatrix)in_stack_ffffffffffffffb8);
        sVar3 = sVar5;
        sVar6 = N_VGetLength((N_Vector)0xed7cbb);
        if (sVar5 == sVar6) {
          local_8 = SUNLinSolNewEmpty((SUNContext)CONCAT44(sVar3,sVar2));
          if (local_8 == (SUNLinearSolver)0x0) {
            local_8 = (SUNLinearSolver)0x0;
          }
          else {
            local_8->ops->gettype = SUNLinSolGetType_Dense;
            local_8->ops->getid = SUNLinSolGetID_Dense;
            local_8->ops->initialize = SUNLinSolInitialize_Dense;
            local_8->ops->setup = SUNLinSolSetup_Dense;
            local_8->ops->solve = SUNLinSolSolve_Dense;
            local_8->ops->lastflag = SUNLinSolLastFlag_Dense;
            local_8->ops->space = SUNLinSolSpace_Dense;
            local_8->ops->free = SUNLinSolFree_Dense;
            piVar7 = (int *)malloc(0x18);
            if (piVar7 == (int *)0x0) {
              SUNLinSolFree(in_stack_ffffffffffffffb8);
              local_8 = (SUNLinearSolver)0x0;
            }
            else {
              local_8->content = piVar7;
              *piVar7 = sVar3;
              piVar7[4] = 0;
              piVar7[2] = 0;
              piVar7[3] = 0;
              pvVar8 = malloc((long)sVar3 << 2);
              *(void **)(piVar7 + 2) = pvVar8;
              if (*(long *)(piVar7 + 2) == 0) {
                SUNLinSolFree(in_stack_ffffffffffffffb8);
                local_8 = (SUNLinearSolver)0x0;
              }
            }
          }
        }
        else {
          local_8 = (SUNLinearSolver)0x0;
        }
      }
      else {
        local_8 = (SUNLinearSolver)0x0;
      }
    }
    else {
      local_8 = (SUNLinearSolver)0x0;
    }
  }
  else {
    local_8 = (SUNLinearSolver)0x0;
  }
  return local_8;
}

Assistant:

SUNLinearSolver SUNLinSol_Dense(N_Vector y, SUNMatrix A, SUNContext sunctx)
{
  SUNLinearSolver S;
  SUNLinearSolverContent_Dense content;
  sunindextype MatrixRows;

  /* Check compatibility with supplied SUNMatrix and N_Vector */
  if (SUNMatGetID(A) != SUNMATRIX_DENSE) return(NULL);

  if (SUNDenseMatrix_Rows(A) != SUNDenseMatrix_Columns(A)) return(NULL);

  if ( (N_VGetVectorID(y) != SUNDIALS_NVEC_SERIAL) &&
       (N_VGetVectorID(y) != SUNDIALS_NVEC_OPENMP) &&
       (N_VGetVectorID(y) != SUNDIALS_NVEC_PTHREADS) )
    return(NULL);

  MatrixRows = SUNDenseMatrix_Rows(A);
  if (MatrixRows != N_VGetLength(y)) return(NULL);

  /* Create an empty linear solver */
  S = NULL;
  S = SUNLinSolNewEmpty(sunctx);
  if (S == NULL) return(NULL);

  /* Attach operations */
  S->ops->gettype    = SUNLinSolGetType_Dense;
  S->ops->getid      = SUNLinSolGetID_Dense;
  S->ops->initialize = SUNLinSolInitialize_Dense;
  S->ops->setup      = SUNLinSolSetup_Dense;
  S->ops->solve      = SUNLinSolSolve_Dense;
  S->ops->lastflag   = SUNLinSolLastFlag_Dense;
  S->ops->space      = SUNLinSolSpace_Dense;
  S->ops->free       = SUNLinSolFree_Dense;

  /* Create content */
  content = NULL;
  content = (SUNLinearSolverContent_Dense) malloc(sizeof *content);
  if (content == NULL) { SUNLinSolFree(S); return(NULL); }

  /* Attach content */
  S->content = content;

  /* Fill content */
  content->N         = MatrixRows;
  content->last_flag = 0;
  content->pivots    = NULL;

  /* Allocate content */
  content->pivots = (sunindextype *) malloc(MatrixRows * sizeof(sunindextype));
  if (content->pivots == NULL) { SUNLinSolFree(S); return(NULL); }

  return(S);
}